

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t h_local;
  size_t i_local;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  *this_local;
  
  if (i < this->capacity_) {
    bVar1 = IsFull(h);
    if (bVar1) {
      SanitizerUnpoisonObject<std::shared_ptr<vmips::VirtReg>>(this->slots_ + i);
    }
    else {
      SanitizerPoisonObject<std::shared_ptr<vmips::VirtReg>>(this->slots_ + i);
    }
    this->ctrl_[i] = h;
    this->ctrl_[(i - 0x10 & this->capacity_) + 1 + (this->capacity_ & 0xf)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x840,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Hash, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::shared_ptr<vmips::VirtReg>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, Hash = phmap::priv::HashEq<vmips::VirtReg *>::Hash, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::shared_ptr<vmips::VirtReg>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }